

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O1

void qlist_read(t_qlist *x,t_symbol *filename,t_symbol *format)

{
  char *__s1;
  int iVar1;
  
  __s1 = format->s_name;
  iVar1 = strcmp(__s1,"cr");
  if (iVar1 == 0) {
    iVar1 = 1;
  }
  else if (*__s1 == '\0') {
    iVar1 = 0;
  }
  else {
    iVar1 = 0;
    pd_error(x,"qlist_read: unknown flag: %s",__s1);
  }
  iVar1 = binbuf_read_via_canvas
                    ((x->x_textbuf).b_binbuf,filename->s_name,(x->x_textbuf).b_canvas,iVar1);
  if (iVar1 != 0) {
    pd_error(x,"%s: read failed",filename->s_name);
  }
  x->x_onset = 0x7fffffff;
  x->x_rewound = 1;
  return;
}

Assistant:

static void qlist_read(t_qlist *x, t_symbol *filename, t_symbol *format)
{
    int cr = 0;
    if (!strcmp(format->s_name, "cr"))
        cr = 1;
    else if (*format->s_name)
        pd_error(x, "qlist_read: unknown flag: %s", format->s_name);

    if (binbuf_read_via_canvas(x->x_binbuf, filename->s_name, x->x_canvas, cr))
            pd_error(x, "%s: read failed", filename->s_name);
    x->x_onset = 0x7fffffff;
    x->x_rewound = 1;
}